

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_42fe24::ConvolveTestBase::IsIndexInBorder(ConvolveTestBase *this,int i)

{
  int iVar1;
  uint uVar2;
  ParamType *pPVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  
  uVar6 = (uint)this;
  pPVar3 = testing::
           WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
           ::GetParam();
  iVar4 = 0x200 - (pPVar3->
                  super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                  ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
                  super__Head_base<1UL,_int,_false>._M_head_impl;
  bVar5 = true;
  if ((int)((iVar4 - (iVar4 >> 0x1f) & 0xfffffffeU) << 8) <= (int)uVar6) {
    pPVar3 = testing::
             WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
             ::GetParam();
    iVar4 = 0x200 - (pPVar3->
                    super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                    ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
                    super__Head_base<1UL,_int,_false>._M_head_impl;
    pPVar3 = testing::
             WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
             ::GetParam();
    if ((int)uVar6 <
        (int)((((uint)(iVar4 - (iVar4 >> 0x1f)) >> 1) +
              (pPVar3->
              super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>).
              super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
              super__Head_base<1UL,_int,_false>._M_head_impl) * 0x200)) {
      uVar2 = uVar6 + 0x1ff;
      if (-1 < (int)uVar6) {
        uVar2 = uVar6;
      }
      iVar4 = uVar6 - (uVar2 & 0xfffffe00);
      pPVar3 = testing::
               WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
               ::GetParam();
      if ((int)((0x200 - *(int *)&(pPVar3->
                                  super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                  ).
                                  super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                  .field_0xc) / 2 + 0xfU & 0xfffffff0) <= iVar4) {
        pPVar3 = testing::
                 WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                 ::GetParam();
        iVar1 = *(int *)&(pPVar3->
                         super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                         ).
                         super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                         .field_0xc;
        pPVar3 = testing::
                 WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                 ::GetParam();
        bVar5 = (int)(((0x200 - iVar1) / 2 + 0xfU & 0xfffffff0) +
                     *(int *)&(pPVar3->
                              super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                              ).
                              super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                              .field_0xc) <= iVar4;
      }
    }
  }
  return bVar5;
}

Assistant:

bool IsIndexInBorder(int i) {
    return (i < BorderTop() * kOuterBlockSize ||
            i >= (BorderTop() + Height()) * kOuterBlockSize ||
            i % kOuterBlockSize < BorderLeft() ||
            i % kOuterBlockSize >= (BorderLeft() + Width()));
  }